

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_nested
          (basic_substring<const_char> *this,CC open,CC close)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t start;
  ulong uVar6;
  basic_substring<const_char> bVar7;
  ro_substr chars;
  long local_50;
  char both [3];
  basic_substring<const_char> local_40;
  
  sVar4 = first_of(this,open,0);
  if (sVar4 == 0xffffffffffffffff) {
LAB_001ecd84:
    local_40.str = (char *)0x0;
    local_40.len = 0;
  }
  else {
    both[2] = '\0';
    local_50 = 0;
    sVar5 = sVar4;
    both[0] = open;
    both[1] = close;
LAB_001ecd35:
    start = sVar5 + 1;
    do {
      chars.len = 2;
      chars.str = both;
      sVar5 = first_of(this,chars,start);
      if (sVar5 == 0xffffffffffffffff) goto LAB_001ecd84;
      if (this->str[sVar5] == open) {
        local_50 = local_50 + 1;
        goto LAB_001ecd35;
      }
    } while (this->str[sVar5] != close);
    if (local_50 != 0) {
      local_50 = local_50 + -1;
      goto LAB_001ecd35;
    }
    uVar1 = this->len;
    if (uVar1 < sVar4) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar7 = (basic_substring<const_char>)(*pcVar2)();
        return bVar7;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1544,"first >= 0 && first <= len");
    }
    uVar6 = sVar5 + 1;
    if (sVar5 + 1 == 0xffffffffffffffff) {
      uVar6 = uVar1;
    }
    if (uVar6 < sVar4) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar7 = (basic_substring<const_char>)(*pcVar2)();
        return bVar7;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1546,"first <= last");
    }
    if (uVar1 < uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar7 = (basic_substring<const_char>)(*pcVar2)();
        return bVar7;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring(&local_40,this->str + sVar4,uVar6 - sVar4);
  }
  bVar7.len = local_40.len;
  bVar7.str = local_40.str;
  return bVar7;
}

Assistant:

basic_substring pair_range_nested(CC open, CC close) const
    {
        size_t b = find(open);
        if(b == npos) return basic_substring();
        size_t e, curr = b+1, count = 0;
        const char both[] = {open, close, '\0'};
        while((e = first_of(both, curr)) != npos)
        {
            if(str[e] == open)
            {
                ++count;
                curr = e+1;
            }
            else if(str[e] == close)
            {
                if(count == 0) return range(b, e+1);
                --count;
                curr = e+1;
            }
        }
        return basic_substring();
    }